

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_hex
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  undefined1 uVar1;
  uint uVar2;
  undefined1 n [16];
  hex_writer f;
  string_view prefix;
  int iVar3;
  long in_RDI;
  string_view sVar4;
  format_specs in_stack_00000000;
  int num_digits;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *this_00;
  undefined8 uVar5;
  undefined1 in_stack_ffffffffffffffe8 [12];
  
  if (*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar2) = 0x30;
    uVar1 = *(undefined1 *)(*(long *)(in_RDI + 8) + 8);
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar2) = uVar1;
  }
  this_00 = *(int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> **)
             (in_RDI + 0x10);
  uVar5 = *(undefined8 *)(in_RDI + 0x18);
  n._8_8_ = in_stack_ffffffffffffff60;
  n._0_8_ = in_stack_ffffffffffffff58;
  iVar3 = count_digits<4u,unsigned__int128>((internal *)this_00,(unsigned___int128)n);
  sVar4 = get_prefix((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *)
                     0x2076af);
  prefix.size_._4_4_ = iVar3;
  prefix._0_12_ = in_stack_ffffffffffffffe8;
  f._8_8_ = uVar5;
  f.self = this_00;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)sVar4.size_,sVar4.data_._4_4_,prefix,
             in_stack_00000000,f);
  return;
}

Assistant:

void on_hex() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = specs.type;
      }
      int num_digits = count_digits<4>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       hex_writer{*this, num_digits});
    }